

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O0

void dequantize_row_iq3_xxs(block_iq3_xxs *x,float *y,int64_t k)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  long lVar5;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  float fVar6;
  float fVar7;
  int j;
  uint8_t *grid2;
  uint8_t *grid1;
  uint8_t signs;
  int l;
  float db;
  int ib32;
  uint8_t *scales_and_signs;
  uint8_t *qs;
  float d;
  int i;
  uint32_t aux32;
  int64_t nb;
  float local_74;
  float local_68;
  int local_64;
  int local_4c;
  int local_44;
  long local_38;
  int local_28;
  long local_10;
  
  local_10 = in_RSI;
  for (local_28 = 0; (long)local_28 < in_RDX / 0x100; local_28 = local_28 + 1) {
    fVar6 = ggml_lookup_fp16_to_fp32(*(ggml_fp16_t *)(in_RDI + (long)local_28 * 0x62));
    lVar5 = in_RDI + (long)local_28 * 0x62;
    local_38 = lVar5 + 2;
    for (local_44 = 0; local_44 < 8; local_44 = local_44 + 1) {
      uVar4 = *(uint *)(lVar5 + 0x42 + (long)(local_44 << 2));
      fVar7 = fVar6 * ((float)(uVar4 >> 0x1c) + 0.5) * 0.5;
      for (local_4c = 0; local_4c < 4; local_4c = local_4c + 1) {
        bVar1 = ""[uVar4 >> ((char)local_4c * '\a' & 0x1fU) & 0x7f];
        bVar2 = *(byte *)(local_38 + (local_4c << 1));
        bVar3 = *(byte *)(local_38 + (local_4c * 2 + 1));
        for (local_64 = 0; local_64 < 4; local_64 = local_64 + 1) {
          local_68 = -1.0;
          if ((bVar1 & kmask_iq2xs[local_64]) == 0) {
            local_68 = 1.0;
          }
          *(float *)(local_10 + (long)local_64 * 4) =
               fVar7 * (float)*(byte *)((long)iq3xxs_grid +
                                       (long)local_64 + (long)(int)(uint)bVar2 * 4) * local_68;
          local_74 = -1.0;
          if ((bVar1 & kmask_iq2xs[local_64 + 4]) == 0) {
            local_74 = 1.0;
          }
          *(float *)(local_10 + (long)(local_64 + 4) * 4) =
               fVar7 * (float)*(byte *)((long)iq3xxs_grid +
                                       (long)local_64 + (long)(int)(uint)bVar3 * 4) * local_74;
        }
        local_10 = local_10 + 0x20;
      }
      local_38 = local_38 + 8;
    }
  }
  return;
}

Assistant:

void dequantize_row_iq3_xxs(const block_iq3_xxs * GGML_RESTRICT x, float * GGML_RESTRICT y, int64_t k) {
    assert(k % QK_K == 0);
    const int64_t nb = k / QK_K;

    uint32_t aux32;

    for (int i = 0; i < nb; i++) {

        const float d = GGML_FP16_TO_FP32(x[i].d);
        const uint8_t * qs = x[i].qs;
        const uint8_t * scales_and_signs = qs + QK_K/4;

        for (int ib32 = 0; ib32 < QK_K/32; ++ib32) {
            memcpy(&aux32, scales_and_signs + 4*ib32, sizeof(uint32_t));
            const float db = d * (0.5f + (aux32 >> 28)) * 0.5f;
            for (int l = 0; l < 4; ++l) {
                const uint8_t  signs = ksigns_iq2xs[(aux32 >> 7*l) & 127];
                const uint8_t * grid1 = (const uint8_t *)(iq3xxs_grid + qs[2*l+0]);
                const uint8_t * grid2 = (const uint8_t *)(iq3xxs_grid + qs[2*l+1]);
                for (int j = 0; j < 4; ++j) {
                    y[j+0] = db * grid1[j] * (signs & kmask_iq2xs[j+0] ? -1.f : 1.f);
                    y[j+4] = db * grid2[j] * (signs & kmask_iq2xs[j+4] ? -1.f : 1.f);
                }
                y += 8;
            }
            qs += 8;
        }
    }
}